

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::TessControlOutputVerticesCase::iterate
          (TessControlOutputVerticesCase *this)

{
  Context *pCVar1;
  bool bVar2;
  int iVar3;
  deUint32 program_00;
  RenderContext *pRVar4;
  Context *pCVar5;
  ProgramSources *pPVar6;
  TestLog *pTVar7;
  TestError *this_00;
  undefined4 extraout_var;
  char *in_RCX;
  allocator<char> local_411;
  string local_410;
  undefined1 local_3f0 [8];
  ResultCollector result;
  CallLogWrapper gl;
  string local_380;
  string local_360;
  string local_340;
  ShaderSource local_320;
  string local_2f8;
  string local_2d8;
  ShaderSource local_2b8;
  string local_290;
  string local_270;
  ShaderSource local_250;
  string local_218;
  string local_1f8;
  ShaderSource local_1d8;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  TessControlOutputVerticesCase *this_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)this;
  checkTessellationSupport((this->super_TessProgramQueryCase).super_TestCase.m_context);
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_TessProgramQueryCase).super_TestCase.m_context);
  glu::ProgramSources::ProgramSources(&local_1b0);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  Functional::(anonymous_namespace)::TessProgramQueryCase::getVertexSource_abi_cxx11_
            (&local_218,this);
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1f8,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::VertexSource::VertexSource((VertexSource *)&local_1d8,&local_1f8);
  pPVar6 = glu::ProgramSources::operator<<(&local_1b0,&local_1d8);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  Functional::(anonymous_namespace)::TessProgramQueryCase::getFragmentSource_abi_cxx11_
            (&local_290,this);
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_270,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::FragmentSource::FragmentSource((FragmentSource *)&local_250,&local_270);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_250);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  Functional::(anonymous_namespace)::TessProgramQueryCase::getTessCtrlSource_abi_cxx11_
            (&local_2f8,this,"layout(vertices=4) out");
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2d8,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)&local_2b8,&local_2d8);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_2b8);
  pCVar1 = (this->super_TessProgramQueryCase).super_TestCase.m_context;
  Functional::(anonymous_namespace)::TessProgramQueryCase::getTessEvalSource_abi_cxx11_
            (&local_360,this,"layout(triangles) in");
  pCVar5 = (Context *)std::__cxx11::string::c_str();
  Functional::(anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_340,(_anonymous_namespace_ *)pCVar1,pCVar5,in_RCX);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_320,&local_340);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,&local_320);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,pRVar4,pPVar6);
  glu::TessellationEvaluationSource::~TessellationEvaluationSource
            ((TessellationEvaluationSource *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::__cxx11::string::~string((string *)&local_360);
  glu::TessellationControlSource::~TessellationControlSource
            ((TessellationControlSource *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  glu::FragmentSource::~FragmentSource((FragmentSource *)&local_250);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_290);
  glu::VertexSource::~VertexSource((VertexSource *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_218);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::operator<<(pTVar7,(ShaderProgram *)local_e0);
  bVar2 = glu::ShaderProgram::isOk((ShaderProgram *)local_e0);
  if (!bVar2) {
    gl._22_1_ = 1;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_380,"failed to build program",(allocator<char> *)&gl.field_0x17);
    tcu::TestError::TestError(this_00,&local_380);
    gl._22_1_ = 0;
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  pRVar4 = gles31::Context::getRenderContext
                     ((this->super_TessProgramQueryCase).super_TestCase.m_context);
  iVar3 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             (Functions *)CONCAT44(extraout_var,iVar3),pTVar7);
  pTVar7 = tcu::TestContext::getLog
                     ((this->super_TessProgramQueryCase).super_TestCase.super_TestCase.
                      super_TestNode.m_testCtx);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_410," // ERROR: ",&local_411);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_3f0,pTVar7,&local_410);
  std::__cxx11::string::~string((string *)&local_410);
  std::allocator<char>::~allocator(&local_411);
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)((long)&result.m_message.field_2 + 8),true);
  program_00 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  deqp::gls::StateQueryUtil::verifyStateProgramInteger
            ((ResultCollector *)local_3f0,(CallLogWrapper *)((long)&result.m_message.field_2 + 8),
             program_00,0x8e75,4,QUERY_PROGRAM_INTEGER);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_3f0,
             (this->super_TessProgramQueryCase).super_TestCase.super_TestCase.super_TestNode.
             m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_3f0);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)((long)&result.m_message.field_2 + 8));
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return STOP;
}

Assistant:

TessControlOutputVerticesCase::IterateResult TessControlOutputVerticesCase::iterate (void)
{
	checkTessellationSupport(m_context);

	glu::ShaderProgram program (m_context.getRenderContext(), glu::ProgramSources()
																<< glu::VertexSource(specializeShader(m_context, getVertexSource().c_str()))
																<< glu::FragmentSource(specializeShader(m_context, getFragmentSource().c_str()))
																<< glu::TessellationControlSource(specializeShader(m_context, getTessCtrlSource("layout(vertices=4) out").c_str()))
																<< glu::TessellationEvaluationSource(specializeShader(m_context, getTessEvalSource("layout(triangles) in").c_str())));

	m_testCtx.getLog() << program;
	if (!program.isOk())
		throw tcu::TestError("failed to build program");

	{
		glu::CallLogWrapper		gl		(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
		tcu::ResultCollector	result	(m_testCtx.getLog(), " // ERROR: ");

		gl.enableLogging(true);
		verifyStateProgramInteger(result, gl, program.getProgram(), GL_TESS_CONTROL_OUTPUT_VERTICES, 4, QUERY_PROGRAM_INTEGER);

		result.setTestContextResult(m_testCtx);
	}
	return STOP;
}